

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_blob_reopen(sqlite3_blob *pBlob,sqlite3_int64 iRow)

{
  sqlite3 *db;
  char *p;
  int err_code;
  char *zFormat;
  long in_FS_OFFSET;
  char *zErr;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (pBlob == (sqlite3_blob *)0x0) {
    err_code = 0x15;
    sqlite3_log(0x15,"%s at line %d of [%.10s]","misuse",0x19358,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    goto LAB_001288ef;
  }
  db = *(sqlite3 **)(pBlob + 0x20);
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
  }
  if (*(long *)(pBlob + 0x18) == 0) {
    err_code = 4;
LAB_001288d4:
    err_code = apiHandleError(db,err_code);
  }
  else {
    local_30 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined4 *)(*(long *)(pBlob + 0x18) + 0x34) = 0;
    err_code = blobSeekToRow((Incrblob *)pBlob,iRow,&local_30);
    p = local_30;
    if (err_code != 0) {
      zFormat = "%s";
      if (local_30 == (char *)0x0) {
        zFormat = (char *)0x0;
      }
      sqlite3ErrorWithMsg(db,err_code,zFormat,local_30);
      if (p != (char *)0x0) {
        sqlite3DbFreeNN(db,p);
      }
      goto LAB_001288d4;
    }
    err_code = 0;
    if (db->mallocFailed != '\0') goto LAB_001288d4;
  }
  if (db->mutex != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(db->mutex);
  }
LAB_001288ef:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return err_code;
  }
  __stack_chk_fail();
}

Assistant:

SQLITE_API int sqlite3_blob_reopen(sqlite3_blob *pBlob, sqlite3_int64 iRow){
  int rc;
  Incrblob *p = (Incrblob *)pBlob;
  sqlite3 *db;

  if( p==0 ) return SQLITE_MISUSE_BKPT;
  db = p->db;
  sqlite3_mutex_enter(db->mutex);

  if( p->pStmt==0 ){
    /* If there is no statement handle, then the blob-handle has
    ** already been invalidated. Return SQLITE_ABORT in this case.
    */
    rc = SQLITE_ABORT;
  }else{
    char *zErr;
    ((Vdbe*)p->pStmt)->rc = SQLITE_OK;
    rc = blobSeekToRow(p, iRow, &zErr);
    if( rc!=SQLITE_OK ){
      sqlite3ErrorWithMsg(db, rc, (zErr ? "%s" : (char*)0), zErr);
      sqlite3DbFree(db, zErr);
    }
    assert( rc!=SQLITE_SCHEMA );
  }

  rc = sqlite3ApiExit(db, rc);
  assert( rc==SQLITE_OK || p->pStmt==0 );
  sqlite3_mutex_leave(db->mutex);
  return rc;
}